

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall
capnp::compiler::Compiler::Node::traverseBrand
          (Node *this,Reader *brand,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  ListElementCount LVar1;
  Reader scope;
  Reader binding;
  IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
  local_158;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *local_148;
  SchemaLoader *local_140;
  Vector<capnp::schema::Node::SourceInfo::Reader> *local_138;
  IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
  local_130;
  Reader local_120;
  Reader local_f0;
  Reader local_c0;
  Reader local_90;
  Reader local_60;
  
  local_148 = seen;
  local_140 = finalLoader;
  local_138 = sourceInfo;
  capnp::schema::Brand::Reader::getScopes(&local_60,brand);
  local_130.container = &local_60;
  for (local_130.index = 0; local_130.index != local_60.reader.elementCount;
      local_130.index = local_130.index + 1) {
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator*(&local_120,&local_130);
    if ((local_120._reader.dataSize < 0x50) || (*(short *)((long)local_120._reader.data + 8) == 0))
    {
      capnp::schema::Brand::Scope::Reader::getBind(&local_c0,&local_120);
      LVar1 = local_c0.reader.elementCount;
      local_158.container = &local_c0;
      for (local_158.index = 0; local_158.index != LVar1; local_158.index = local_158.index + 1) {
        _::
        IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
        ::operator*(&local_f0,&local_158);
        if ((0xf < local_f0._reader.dataSize) && (*local_f0._reader.data == 1)) {
          capnp::schema::Brand::Binding::Reader::getType(&local_90,&local_f0);
          traverseType(this,&local_90,eagerness,local_148,local_140,local_138);
        }
      }
    }
  }
  return;
}

Assistant:

void Compiler::Node::traverseBrand(
    const schema::Brand::Reader& brand, uint eagerness,
    std::unordered_map<Node*, uint>& seen,
    const SchemaLoader& finalLoader,
    kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  for (auto scope: brand.getScopes()) {
    switch (scope.which()) {
      case schema::Brand::Scope::BIND:
        for (auto binding: scope.getBind()) {
          switch (binding.which()) {
            case schema::Brand::Binding::UNBOUND:
              break;
            case schema::Brand::Binding::TYPE:
              traverseType(binding.getType(), eagerness, seen, finalLoader, sourceInfo);
              break;
          }
        }
        break;
      case schema::Brand::Scope::INHERIT:
        break;
    }
  }
}